

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O3

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>::GradX<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoTriangle> *this,TPZFMatrix<double> *cornerco,
          TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *gradx)

{
  Fad<double> *pFVar1;
  double dVar2;
  TPZFMatrix<double> *pTVar3;
  uint uVar4;
  double *pdVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  TPZTriangleSphere<pzgeom::TPZGeoTriangle> *pTVar8;
  double *pdVar9;
  EVP_PKEY_CTX *pEVar10;
  ulong uVar11;
  ulong uVar12;
  EVP_PKEY_CTX *pEVar13;
  int i;
  uint uVar14;
  Fad<double> *pFVar15;
  long lVar16;
  long lVar17;
  value_type vVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Fad<double> a;
  Fad<double> b;
  Fad<double> NormValue;
  TPZVec<double> Xc;
  TPZFNMatrix<3,_Fad<double>_> XtminusXc;
  TPZFNMatrix<9,_Fad<double>_> GradXt;
  TPZFNMatrix<9,_Fad<double>_> GradOneoverNorm;
  TPZFNMatrix<9,_Fad<double>_> TensorXtGradX;
  TPZManVector<Fad<double>,_3> XTriangle;
  TPZFNMatrix<9,_Fad<double>_> GradXtScaled;
  undefined1 local_b38 [16];
  EVP_PKEY_CTX *local_b28;
  double local_b20;
  undefined1 local_b18 [16];
  MEM_CPY<double> *local_b08;
  double local_b00;
  Fad<double> local_af8;
  undefined1 local_ad8 [16];
  EVP_PKEY_CTX *local_ac8;
  double local_ac0;
  Fad<double> local_ab8;
  Fad<double> local_a98;
  TPZFMatrix<Fad<double>_> local_a78;
  TPZFMatrix<double> *local_9e8;
  undefined8 uStack_9e0;
  TPZVec<Fad<double>_> *local_9d8;
  undefined8 uStack_9d0;
  TPZFMatrix<Fad<double>_> *local_9c0;
  TPZTriangleSphere<pzgeom::TPZGeoTriangle> *local_9b8;
  TPZVec<double> local_9b0;
  TPZFNMatrix<3,_Fad<double>_> local_990;
  undefined1 local_880 [144];
  undefined1 local_7f0 [24];
  double *pdStack_7d8;
  Fad<double> *local_7d0;
  Fad<double> *local_7c8;
  int64_t local_7c0;
  TPZVec<int> local_7b8;
  int local_798 [6];
  undefined **local_780;
  Fad<double> *local_778;
  int64_t iStack_770;
  int64_t local_768;
  Fad<double> local_760 [10];
  undefined1 local_620 [32];
  Fad<double> *local_600;
  undefined1 local_450 [32];
  Fad<double> *local_430;
  TPZManVector<Fad<double>,_3> local_280;
  undefined1 local_200 [464];
  long lVar23;
  
  local_620._0_8_ = (_func_int **)0x0;
  local_620._8_4_ = 0;
  local_620._16_8_ = (double *)0x0;
  local_620._24_8_ = 0.0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_280,3,(Fad<double> *)local_620);
  Fad<double>::~Fad((Fad<double> *)local_620);
  local_450._0_8_ = (_func_int **)0x0;
  local_450._8_4_ = 0;
  local_450._16_8_ = (double *)0x0;
  local_450._24_8_ = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_620,3,1,(Fad<double> *)local_450);
  Fad<double>::~Fad((Fad<double> *)local_450);
  local_200._0_8_ = (_func_int **)0x0;
  local_200._8_4_ = 0;
  local_200._16_8_ = (double *)0x0;
  local_200._24_8_ = 0.0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_450,3,2,(Fad<double> *)local_200);
  Fad<double>::~Fad((Fad<double> *)local_200);
  local_7f0._0_8_ = (_func_int **)0x0;
  local_7f0._8_4_ = 0;
  local_7f0._16_8_ = (double *)0x0;
  pdStack_7d8 = (double *)0x0;
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_200,3,3,(Fad<double> *)local_7f0);
  Fad<double>::~Fad((Fad<double> *)local_7f0);
  TPZGeoTriangle::X<Fad<double>>(cornerco,par,&local_280.super_TPZVec<Fad<double>_>);
  local_7f0._0_8_ = (_func_int **)0x0;
  local_7f0._8_8_ = (ulong)(uint)local_7f0._12_4_ << 0x20;
  local_7f0._16_8_ = (double *)0x0;
  pdStack_7d8 = (double *)0x0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&local_990,3,1,(Fad<double> *)local_7f0);
  local_9e8 = cornerco;
  local_9d8 = par;
  local_9c0 = gradx;
  Fad<double>::~Fad((Fad<double> *)local_7f0);
  local_9b8 = this;
  TPZVec<double>::TPZVec(&local_9b0,&this->fXc);
  if (0 < local_280.super_TPZVec<Fad<double>_>.fNElements) {
    lVar17 = 0;
    do {
      pFVar15 = local_280.super_TPZVec<Fad<double>_>.fStore + lVar17;
      dVar2 = local_9b0.fStore[lVar17];
      if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.
           super_TPZBaseMatrix.fRow <= lVar17) ||
         (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix
          .fCol < 1)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pFVar1 = local_990.super_TPZFMatrix<Fad<double>_>.fElem + lVar17;
      uVar14 = (pFVar15->dx_).num_elts;
      uVar11 = (ulong)uVar14;
      uVar4 = local_990.super_TPZFMatrix<Fad<double>_>.fElem[lVar17].dx_.num_elts;
      if (uVar14 == uVar4) {
        if (uVar14 != 0) {
          pdVar9 = (pFVar1->dx_).ptr_to_data;
LAB_00f6bb22:
          if (0 < (int)uVar14) {
            pdVar5 = (pFVar15->dx_).ptr_to_data;
            uVar12 = 0;
            do {
              pdVar9[uVar12] = pdVar5[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
        }
      }
      else if (uVar14 == 0) {
        if (uVar4 != 0) {
          pdVar9 = (pFVar1->dx_).ptr_to_data;
          if (pdVar9 != (double *)0x0) {
            operator_delete__(pdVar9);
          }
          (pFVar1->dx_).num_elts = 0;
          (pFVar1->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        if (uVar4 != 0) {
          pdVar9 = (pFVar1->dx_).ptr_to_data;
          if (pdVar9 != (double *)0x0) {
            operator_delete__(pdVar9);
          }
          (pFVar1->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar1->dx_).num_elts = uVar14;
        uVar12 = uVar11 * 8;
        if ((int)uVar14 < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        pdVar9 = (double *)operator_new__(uVar12);
        (pFVar1->dx_).ptr_to_data = pdVar9;
        if ((pFVar15->dx_).num_elts != 0) goto LAB_00f6bb22;
        if (0 < (int)uVar14) {
          dVar19 = pFVar15->defaultVal;
          lVar16 = uVar11 - 1;
          auVar29._8_4_ = (int)lVar16;
          auVar29._0_8_ = lVar16;
          auVar29._12_4_ = (int)((ulong)lVar16 >> 0x20);
          auVar29 = auVar29 ^ _DAT_014d28c0;
          lVar16 = 0;
          auVar21 = _DAT_014d28b0;
          do {
            auVar24 = auVar21 ^ _DAT_014d28c0;
            auVar27._0_4_ = -(uint)(auVar29._0_4_ < auVar24._0_4_);
            auVar27._4_4_ = -(uint)(auVar29._4_4_ < auVar24._4_4_);
            auVar27._8_4_ = -(uint)(auVar29._8_4_ < auVar24._8_4_);
            auVar27._12_4_ = -(uint)(auVar29._12_4_ < auVar24._12_4_);
            iVar25 = -(uint)(auVar24._4_4_ == auVar29._4_4_);
            iVar26 = -(uint)(auVar24._12_4_ == auVar29._12_4_);
            auVar28._4_4_ = iVar25;
            auVar28._0_4_ = iVar25;
            auVar28._8_4_ = iVar26;
            auVar28._12_4_ = iVar26;
            auVar24._4_4_ = auVar27._4_4_;
            auVar24._0_4_ = auVar27._4_4_;
            auVar24._8_4_ = auVar27._12_4_;
            auVar24._12_4_ = auVar27._12_4_;
            auVar24 = auVar24 | auVar28 & auVar27;
            if ((~auVar24._0_4_ & 1) != 0) {
              *(double *)((long)pdVar9 + lVar16) = dVar19;
            }
            if (((auVar24 ^ _DAT_014df3a0) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(double *)((long)pdVar9 + lVar16 + 8) = dVar19;
            }
            lVar23 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 2;
            auVar21._8_8_ = lVar23 + 2;
            lVar16 = lVar16 + 0x10;
          } while ((ulong)(uVar14 + 1 >> 1) << 4 != lVar16);
        }
      }
      pFVar1->val_ = pFVar15->val_ - dVar2;
      lVar17 = lVar17 + 1;
    } while (lVar17 < local_280.super_TPZVec<Fad<double>_>.fNElements);
  }
  Dot<Fad<double>>((Fad<double> *)local_880,&local_990.super_TPZFMatrix<Fad<double>_>,
                   &local_990.super_TPZFMatrix<Fad<double>_>);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt
            ((FadFuncSqrt<Fad<double>_> *)&local_a78,(Fad<double> *)local_880);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_7f0,
             (FadFuncSqrt<Fad<double>_> *)&local_a78);
  Fad<double>::~Fad((Fad<double> *)&local_a78);
  if ((double)local_7f0._8_8_ < 0.0) {
    local_ab8.val_ = sqrt((double)local_7f0._8_8_);
  }
  else {
    local_ab8.val_ = SQRT((double)local_7f0._8_8_);
  }
  Fad<double>::~Fad((Fad<double> *)(local_7f0 + 8));
  Fad<double>::~Fad((Fad<double> *)local_880);
  local_ab8.dx_.num_elts = 0;
  local_ab8.dx_.ptr_to_data = (double *)0x0;
  local_ab8.defaultVal = 0.0;
  pFVar15 = local_760;
  local_7f0._8_8_ = 0.0;
  local_7f0._16_8_ = (double *)0x0;
  pdStack_7d8 = (double *)((ulong)pdStack_7d8 & 0xffffffffffff0000);
  local_7f0._0_8_ = &PTR__TPZFMatrix_0184fa68;
  local_7c0 = 9;
  local_7d0 = pFVar15;
  local_7c8 = pFVar15;
  TPZVec<int>::TPZVec(&local_7b8,0);
  local_7b8.fStore = local_798;
  local_7b8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_7b8.fNElements = 0;
  local_7b8.fNAlloc = 0;
  local_780 = &PTR__TPZVec_0181ee50;
  local_778 = (Fad<double> *)0x0;
  iStack_770 = 0;
  lVar17 = 0;
  local_768 = 0;
  local_7d0 = (Fad<double> *)0x0;
  local_7f0._0_8_ = &PTR__TPZFNMatrix_0184f778;
  do {
    Fad<double>::Fad(pFVar15);
    lVar17 = lVar17 + -0x20;
    pFVar15 = pFVar15 + 1;
  } while (lVar17 != -0x140);
  TPZGeoTriangle::GradX<Fad<double>>(local_9e8,local_9d8,(TPZFMatrix<Fad<double>_> *)local_7f0);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 1) || ((long)local_7f0._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b18._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  local_b18._8_8_ = local_7d0;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 2) || ((long)local_7f0._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b38._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1;
  local_b38._8_8_ = local_7d0 + 1;
  local_880._0_8_ = local_b18;
  local_880._8_8_ = local_b38;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 3) || ((long)local_7f0._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_ad8._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2;
  local_ad8._8_8_ = local_7d0 + 2;
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_880;
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_ad8;
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_600,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)&local_a78);
  pTVar8 = local_9b8;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 1) || ((long)local_7f0._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b18._8_8_ = local_7d0 + local_7f0._8_8_;
  local_b18._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 2) || ((long)local_7f0._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_b38._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1;
  local_b38._8_8_ = local_7d0 + local_7f0._8_8_ + 1;
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    local_880._0_8_ = local_b18;
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (((long)local_7f0._8_8_ < 3) || ((long)local_7f0._16_8_ < 2)) {
    local_880._0_8_ = local_b18;
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_ad8._0_8_ = local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2;
  local_ad8._8_8_ = local_7d0 + local_7f0._8_8_ + 2;
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)local_880;
    local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_ad8;
    local_880._0_8_ = local_b18;
    local_880._8_8_ = local_b38;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_880;
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_ad8;
  local_880._0_8_ = local_b18;
  local_880._8_8_ = local_b38;
  Fad<double>::operator=
            (local_600 + 1,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)&local_a78);
  uVar6 = local_b38._8_8_;
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)&local_ab8;
  local_b38._0_8_ = local_ab8.val_ * local_ab8.val_ * local_ab8.val_;
  lVar17 = (long)local_ab8.dx_.num_elts;
  local_b38._8_8_ = local_b38._8_8_ & 0xffffffff00000000;
  local_b28 = (EVP_PKEY_CTX *)0x0;
  local_880._0_8_ = local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
  local_880._8_8_ = local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
  if (lVar17 < 1) {
    local_b20 = 0.0;
    uVar14 = 0;
    local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)local_880;
  }
  else {
    local_b38._12_4_ = SUB84(uVar6,4);
    local_b38._8_4_ = local_ab8.dx_.num_elts;
    local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)local_880;
    local_b28 = (EVP_PKEY_CTX *)operator_new__(lVar17 * 8);
    local_b20 = 0.0;
    lVar16 = 0;
    do {
      vVar18 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                         ((FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>
                           *)&local_a78,(int)lVar16);
      *(value_type *)(local_b28 + lVar16 * 8) = vVar18;
      lVar16 = lVar16 + 1;
    } while (lVar17 != lVar16);
    uVar14 = local_b38._8_4_;
  }
  uVar7 = local_ad8._8_8_;
  uVar6 = local_b38._0_8_;
  pTVar3 = (TPZFMatrix<double> *)pTVar8->fR;
  local_af8.val_ = -(double)pTVar3 / (double)local_b38._0_8_;
  local_ad8._8_8_ = local_ad8._8_8_ & 0xffffffff00000000;
  local_ac8 = (EVP_PKEY_CTX *)0x0;
  local_ad8._0_8_ = local_af8.val_;
  if ((int)uVar14 < 1) {
    local_ac0 = 0.0;
    local_af8.dx_.num_elts = 0;
    local_af8.dx_.ptr_to_data = (double *)0x0;
    local_af8.defaultVal = 0.0;
    local_880._8_8_ = local_880._8_8_ & 0xffffffff00000000;
    local_880._16_8_ = (MEM_CPY<double> *)0x0;
    local_880._0_8_ = local_af8.val_;
  }
  else {
    uStack_9e0 = 0;
    uStack_9d0 = 0x8000000000000000;
    local_ad8._12_4_ = SUB84(uVar7,4);
    local_ad8._8_4_ = uVar14;
    uVar12 = (ulong)uVar14;
    local_9e8 = pTVar3;
    local_9d8 = (TPZVec<Fad<double>_> *)local_af8.val_;
    pEVar10 = (EVP_PKEY_CTX *)operator_new__(uVar12 * 8);
    local_ac0 = 0.0;
    uVar11 = 0;
    do {
      *(double *)(pEVar10 + uVar11 * 8) =
           (*(double *)(local_b28 + uVar11 * 8) * (double)local_9e8) /
           ((double)uVar6 * (double)uVar6);
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
    local_af8.val_ = (double)local_9d8;
    local_af8.dx_.ptr_to_data = (double *)0x0;
    local_af8.dx_.num_elts = uVar14;
    local_ac8 = pEVar10;
    local_af8.dx_.ptr_to_data = (double *)operator_new__(uVar12 << 3);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_af8.dx_.ptr_to_data,pEVar10,(EVP_PKEY_CTX *)(ulong)uVar14);
    iVar25 = local_af8.dx_.num_elts;
    local_af8.defaultVal = local_ac0;
    local_880._0_8_ = local_af8.val_;
    local_880._8_4_ = local_af8.dx_.num_elts;
    local_880._16_8_ = (MEM_CPY<double> *)0x0;
    if ((long)local_af8.dx_.num_elts != 0) {
      uVar11 = 0xffffffffffffffff;
      if (-1 < local_af8.dx_.num_elts) {
        uVar11 = (long)local_af8.dx_.num_elts * 8;
      }
      local_880._16_8_ = operator_new__(uVar11);
      MEM_CPY<double>::copy
                ((MEM_CPY<double> *)local_880._16_8_,(EVP_PKEY_CTX *)local_af8.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)(ulong)(uint)iVar25);
    }
  }
  local_880._24_8_ = local_af8.defaultVal;
  TPZFMatrix<Fad<double>_>::operator*
            (&local_a78,(TPZFMatrix<Fad<double>_> *)local_620,(Fad<double> *)local_880);
  Fad<double>::~Fad((Fad<double> *)local_880);
  TPZFMatrix<Fad<double>_>::operator=((TPZFMatrix<Fad<double>_> *)local_620,&local_a78);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_a78);
  Fad<double>::~Fad(&local_af8);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_600;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 1) || ((long)local_450._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=(local_430,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a78);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 1) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)(local_600 + 1);
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)local_990.super_TPZFMatrix<Fad<double>_>.fElem;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 1) || ((long)local_450._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + CONCAT44(local_450._12_4_,local_450._8_4_),
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a78);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1);
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_600;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 2) || ((long)local_450._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + 1,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a78);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 2) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 1);
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)(local_600 + 1);
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 2) || ((long)local_450._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + CONCAT44(local_450._12_4_,local_450._8_4_) + 1,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a78);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 1) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2);
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)local_600;
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 3) || ((long)local_450._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + 2,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a78);
  if ((local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
       fRow < 3) ||
     (local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if ((CONCAT44(local_620._12_4_,local_620._8_4_) < 2) || ((long)local_620._16_8_ < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)(local_990.super_TPZFMatrix<Fad<double>_>.fElem + 2);
  local_a78.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = (int64_t)(local_600 + 1);
  if ((CONCAT44(local_450._12_4_,local_450._8_4_) < 3) || ((long)local_450._16_8_ < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Fad<double>::operator=
            (local_430 + CONCAT44(local_450._12_4_,local_450._8_4_) + 2,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_a78);
  iVar25 = local_ab8.dx_.num_elts;
  dVar2 = pTVar8->fR;
  pEVar10 = (EVP_PKEY_CTX *)(ulong)(uint)local_ab8.dx_.num_elts;
  if (local_ab8.dx_.num_elts == local_b38._8_4_) {
    if (local_ab8.dx_.num_elts == 0) goto LAB_00f6cc90;
  }
  else {
    if (local_ab8.dx_.num_elts == 0) {
      if (local_b38._8_4_ != 0) {
        if (local_b28 != (EVP_PKEY_CTX *)0x0) {
          operator_delete__(local_b28);
        }
        local_b38._8_8_ = local_b38._8_8_ & 0xffffffff00000000;
        local_b28 = (EVP_PKEY_CTX *)0x0;
      }
      goto LAB_00f6cc90;
    }
    if (local_b38._8_4_ != 0) {
      if (local_b28 != (EVP_PKEY_CTX *)0x0) {
        operator_delete__(local_b28);
      }
      local_b28 = (EVP_PKEY_CTX *)0x0;
    }
    local_b38._8_4_ = iVar25;
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar25) {
      uVar11 = (long)pEVar10 * 8;
    }
    local_b28 = (EVP_PKEY_CTX *)operator_new__(uVar11);
    auVar21 = _DAT_014d28c0;
    if (local_ab8.dx_.num_elts == 0) {
      if (0 < iVar25) {
        dVar19 = (-local_ab8.defaultVal * dVar2) / (local_ab8.val_ * local_ab8.val_);
        pEVar13 = pEVar10 + -1;
        auVar20._8_4_ = (int)pEVar13;
        auVar20._0_8_ = pEVar13;
        auVar20._12_4_ = (int)((ulong)pEVar13 >> 0x20);
        lVar17 = 0;
        auVar20 = auVar20 ^ _DAT_014d28c0;
        auVar22 = _DAT_014d28b0;
        do {
          auVar29 = auVar22 ^ auVar21;
          if ((bool)(~(auVar29._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar29._0_4_ ||
                      auVar20._4_4_ < auVar29._4_4_) & 1)) {
            *(double *)(local_b28 + lVar17) = dVar19;
          }
          if ((auVar29._12_4_ != auVar20._12_4_ || auVar29._8_4_ <= auVar20._8_4_) &&
              auVar29._12_4_ <= auVar20._12_4_) {
            *(double *)(local_b28 + lVar17 + 8) = dVar19;
          }
          lVar16 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 2;
          auVar22._8_8_ = lVar16 + 2;
          lVar17 = lVar17 + 0x10;
        } while ((ulong)(iVar25 + 1U >> 1) << 4 != lVar17);
      }
      goto LAB_00f6cc90;
    }
  }
  if (0 < iVar25) {
    pEVar13 = (EVP_PKEY_CTX *)0x0;
    do {
      *(double *)(local_b28 + (long)pEVar13 * 8) =
           (-local_ab8.dx_.ptr_to_data[(long)pEVar13] * dVar2) / (local_ab8.val_ * local_ab8.val_);
      pEVar13 = pEVar13 + 1;
    } while (pEVar10 != pEVar13);
  }
LAB_00f6cc90:
  local_b38._0_8_ = dVar2 / local_ab8.val_;
  local_a98.dx_.num_elts = iVar25;
  local_a98.dx_.ptr_to_data = (double *)0x0;
  local_a98.val_ = (double)local_b38._0_8_;
  if (iVar25 == 0) {
    local_a98.defaultVal = local_b20;
    local_b18._8_8_ = local_b18._8_8_ & 0xffffffff00000000;
    local_b08 = (MEM_CPY<double> *)0x0;
    local_b18._0_8_ = local_b38._0_8_;
  }
  else {
    uVar11 = 0xffffffffffffffff;
    if (-1 < iVar25) {
      uVar11 = (long)iVar25 << 3;
    }
    local_a98.dx_.ptr_to_data = (double *)operator_new__(uVar11);
    MEM_CPY<double>::copy((MEM_CPY<double> *)local_a98.dx_.ptr_to_data,local_b28,pEVar10);
    iVar25 = local_a98.dx_.num_elts;
    local_a98.defaultVal = local_b20;
    local_b18._0_8_ = local_a98.val_;
    local_b18._8_4_ = local_a98.dx_.num_elts;
    local_b08 = (MEM_CPY<double> *)0x0;
    if ((long)local_a98.dx_.num_elts != 0) {
      uVar11 = 0xffffffffffffffff;
      if (-1 < local_a98.dx_.num_elts) {
        uVar11 = (long)local_a98.dx_.num_elts * 8;
      }
      local_b08 = (MEM_CPY<double> *)operator_new__(uVar11);
      MEM_CPY<double>::copy
                (local_b08,(EVP_PKEY_CTX *)local_a98.dx_.ptr_to_data,
                 (EVP_PKEY_CTX *)(ulong)(uint)iVar25);
    }
  }
  local_b00 = local_a98.defaultVal;
  TPZFMatrix<Fad<double>_>::operator*
            ((TPZFMatrix<Fad<double>_> *)local_880,(TPZFMatrix<Fad<double>_> *)local_7f0,
             (Fad<double> *)local_b18);
  Fad<double>::~Fad((Fad<double> *)local_b18);
  TPZFMatrix<Fad<double>_>::operator+
            (&local_a78,(TPZFMatrix<Fad<double>_> *)local_880,(TPZFMatrix<Fad<double>_> *)local_450)
  ;
  TPZFMatrix<Fad<double>_>::operator=(local_9c0,&local_a78);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_a78);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_880);
  Fad<double>::~Fad(&local_a98);
  Fad<double>::~Fad((Fad<double> *)local_ad8);
  Fad<double>::~Fad((Fad<double> *)local_b38);
  local_7f0._0_8_ = &PTR__TPZFNMatrix_0184f778;
  lVar17 = 0x1b0;
  do {
    Fad<double>::~Fad((Fad<double> *)(local_7f0 + lVar17));
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != 0x70);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_7f0,&PTR_PTR_0184fa30);
  Fad<double>::~Fad(&local_ab8);
  local_9b0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_9b0.fStore != (double *)0x0) {
    operator_delete__(local_9b0.fStore);
  }
  local_990.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01850138;
  lVar17 = 0xf0;
  do {
    Fad<double>::~Fad((Fad<double> *)
                      ((long)&((TPZFMatrix<Fad<double>_> *)
                              (&((TPZFMatrix<Fad<double>_> *)
                                (&local_990.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->fPivot +
                              -1))->fPivot + lVar17 + 0xffffffffffffffc8U));
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != 0x70);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_990.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_018503f0)
  ;
  local_200._0_8_ = &PTR__TPZFNMatrix_0184f778;
  lVar17 = 0x1b0;
  do {
    Fad<double>::~Fad((Fad<double> *)(local_200 + lVar17));
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != 0x70);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_200,&PTR_PTR_0184fa30);
  local_450._0_8_ = &PTR__TPZFNMatrix_0184f778;
  lVar17 = 0x1b0;
  do {
    Fad<double>::~Fad((Fad<double> *)(local_450 + lVar17));
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != 0x70);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_450,&PTR_PTR_0184fa30);
  local_620._0_8_ = &PTR__TPZFNMatrix_0184f778;
  lVar17 = 0x1b0;
  do {
    Fad<double>::~Fad((Fad<double> *)(local_620 + lVar17));
    lVar17 = lVar17 + -0x20;
  } while (lVar17 != 0x70);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_620,&PTR_PTR_0184fa30);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&local_280);
  return;
}

Assistant:

void GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
        {
            TPZManVector<T,3> XTriangle(3,0.0);
            TPZFNMatrix<9,T> GradOneoverNorm(3,1,0.0);
            TPZFNMatrix<9,T> TensorXtGradX(3,2,0.0);
            TPZFNMatrix<9,T> GradXtScaled(3,3,0.0);
            
            //            TPZFNMatrix<3*NNodes> coord(3,NNodes);
            //            CornerCoordinates(gel, coord);
            
            GeomTriang::X(cornerco,par,XTriangle);
            TPZFNMatrix<3,T> XtminusXc(3,1,0.0);
            TPZVec<REAL> Xc= fXc;
            
            for (int i = 0; i < XTriangle.size(); i++)
            { XtminusXc(i,0)= XTriangle[i] - Xc[i]; }
            T NormValue = Norm(XtminusXc);
            
            
            TPZFNMatrix<9,T> GradXt;
            GeomTriang::GradX(cornerco,par,GradXt);
            
            GradOneoverNorm(0,0) = XtminusXc(0,0)*GradXt(0,0)+XtminusXc(1,0)*GradXt(1,0)+XtminusXc(2,0)*GradXt(2,0);
            GradOneoverNorm(1,0) = XtminusXc(0,0)*GradXt(0,1)+XtminusXc(1,0)*GradXt(1,1)+XtminusXc(2,0)*GradXt(2,1);
            T a = (NormValue*NormValue*NormValue);
            T b = -fR/a;
            GradOneoverNorm = b*GradOneoverNorm;
            
            TensorXtGradX(0,0)= XtminusXc(0,0)*GradOneoverNorm(0,0);
            TensorXtGradX(0,1)= XtminusXc(0,0)*GradOneoverNorm(1,0);
            TensorXtGradX(1,0)= XtminusXc(1,0)*GradOneoverNorm(0,0);
            TensorXtGradX(1,1)= XtminusXc(1,0)*GradOneoverNorm(1,0);
            TensorXtGradX(2,0)= XtminusXc(2,0)*GradOneoverNorm(0,0);
            TensorXtGradX(2,1)= XtminusXc(2,0)*GradOneoverNorm(1,0);
            a = fR/NormValue;
            gradx=a*GradXt+TensorXtGradX;

        }